

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O2

void test_null(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  VALUE v;
  
  v.data[0] = '\0';
  v.data[1] = '\0';
  v.data[2] = '\0';
  v.data[3] = '\0';
  v.data[4] = '\0';
  v.data[5] = '\0';
  v.data[6] = '\0';
  v.data[7] = '\0';
  v.data[8] = '\0';
  v.data[9] = '\0';
  v.data[10] = '\0';
  v.data[0xb] = '\0';
  v.data[0xc] = '\0';
  v.data[0xd] = '\0';
  v.data[0xe] = '\0';
  v.data[0xf] = '\0';
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_NULL);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3b,"%s","value_is_compatible(NULL, VALUE_NULL)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3c,"%s","!value_is_compatible(NULL, VALUE_BOOL)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3d,"%s","!value_is_compatible(NULL, VALUE_INT32)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_UINT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3e,"%s","!value_is_compatible(NULL, VALUE_UINT32)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_INT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x3f,"%s","!value_is_compatible(NULL, VALUE_INT64)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_UINT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x40,"%s","!value_is_compatible(NULL, VALUE_UINT64)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x41,"%s","!value_is_compatible(NULL, VALUE_FLOAT)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x42,"%s","!value_is_compatible(NULL, VALUE_DOUBLE)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x43,"%s","!value_is_compatible(NULL, VALUE_ARRAY)");
  iVar1 = value_is_compatible((VALUE *)0x0,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x44,"%s","!value_is_compatible(NULL, VALUE_DICT)");
  iVar1 = value_is_compatible(&v,VALUE_NULL);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x46,"%s","value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(&v,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x47,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(&v,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x48,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(&v,VALUE_UINT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x49,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(&v,VALUE_INT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4a,"%s","!value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(&v,VALUE_UINT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4b,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(&v,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4c,"%s","!value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&v,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4d,"%s","!value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&v,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4e,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&v,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x4f,"%s","!value_is_compatible(&v, VALUE_DICT)");
  VVar2 = value_type(&v);
  acutest_check_((uint)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x51,"%s","value_type(&v) == VALUE_NULL");
  iVar1 = value_is_new(&v);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x52,"%s","!value_is_new(&v)");
  v.data[8] = 0xff;
  v.data[9] = 0xff;
  v.data[10] = 0xff;
  v.data[0xb] = 0xff;
  v.data[0] = 0xff;
  v.data[1] = 0xff;
  v.data[2] = 0xff;
  v.data[3] = 0xff;
  v.data[4] = 0xff;
  v.data[5] = 0xff;
  v.data[6] = 0xff;
  v.data[7] = 0xff;
  v.data[0xc] = 0xff;
  v.data[0xd] = 0xff;
  v.data[0xe] = 0xff;
  v.data[0xf] = 0xff;
  value_init_null(&v);
  VVar2 = value_type(&v);
  acutest_check_((uint)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x57,"%s","value_type(&v) == VALUE_NULL");
  iVar1 = value_is_new(&v);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x58,"%s","!value_is_new(&v)");
  value_fini(&v);
  return;
}

Assistant:

static void
test_null(void)
{
    VALUE v = VALUE_NULL_INITIALIZER;

    TEST_CHECK(value_is_compatible(NULL, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(NULL, VALUE_DICT));

    TEST_CHECK(value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));

    TEST_CHECK(value_type(&v) == VALUE_NULL);
    TEST_CHECK(!value_is_new(&v));

    memset(&v, 0xff, sizeof(VALUE));

    value_init_null(&v);
    TEST_CHECK(value_type(&v) == VALUE_NULL);
    TEST_CHECK(!value_is_new(&v));
    value_fini(&v);
}